

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status
parse_full_uri(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  curi_settings *pcVar1;
  curi_settings *str;
  byte bVar2;
  ulong uVar3;
  _func_int_void_ptr_char_ptr_size_t *p_Var4;
  size_t sVar5;
  _func_int_void_ptr_uint *p_Var6;
  int iVar7;
  curi_status cVar8;
  curi_status cVar9;
  curi_settings *pcVar10;
  char *pcVar11;
  curi_settings *pcVar12;
  curi_settings *pcVar13;
  byte *pbVar14;
  size_t sVar15;
  size_t initialOffset;
  void *pvVar16;
  ulong uVar17;
  size_t sVar18;
  size_t initialOffset_1;
  long lVar19;
  uint uVar20;
  char *pcVar21;
  void *userData_00;
  void *pvVar22;
  void *pvVar23;
  bool bVar24;
  size_t __TRY_initialOffset_3;
  
  uVar3 = *offset;
  pbVar14 = (byte *)"";
  if (uVar3 < len) {
    pbVar14 = (byte *)(uri + uVar3);
  }
  *offset = uVar3 + 1;
  if (0x39 < *pbVar14 - 0x41) {
    return curi_status_error;
  }
  if ((0x3ffffff03ffffffU >> ((ulong)(*pbVar14 - 0x41) & 0x3f) & 1) == 0) {
    return curi_status_error;
  }
  bVar24 = true;
  uVar17 = uVar3 + 1;
  userData_00 = userData;
switchD_00101482_caseD_2b:
  sVar15 = uVar17;
  if (bVar24) {
    pcVar21 = uri + sVar15;
    if (len <= sVar15) {
      pcVar21 = "";
    }
    *offset = sVar15 + 1;
    uVar20 = (byte)*pcVar21 - 0x2b;
    if (uVar20 < 0x50) goto code_r0x00101478;
    goto switchD_00101482_caseD_2c;
  }
  if (settings->scheme_callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && sVar15 - uVar3 != 0)
  {
    iVar7 = (*settings->scheme_callback)(userData,uri + uVar3,sVar15 - uVar3);
    if (iVar7 == 0) {
      return curi_status_canceled;
    }
    sVar15 = *offset;
  }
  pcVar21 = uri + sVar15;
  if (len <= sVar15) {
    pcVar21 = "";
  }
  uVar3 = sVar15 + 1;
  *offset = uVar3;
  if (*pcVar21 != ':') {
    return curi_status_error;
  }
  pcVar21 = uri + uVar3;
  if (len <= uVar3) {
    pcVar21 = "";
  }
  uVar17 = sVar15 + 2;
  *offset = uVar17;
  if (*pcVar21 == '/') {
    pcVar21 = uri + uVar17;
    if (len <= uVar17) {
      pcVar21 = "";
    }
    pvVar16 = (void *)(sVar15 + 3);
    *offset = (size_t)pvVar16;
    if (*pcVar21 != '/') goto LAB_001019c3;
    cVar8 = curi_status_success;
    pvVar23 = pvVar16;
switchD_0010155a_caseD_21:
    pvVar22 = pvVar23;
    pcVar21 = uri + (long)pvVar22;
    if (len <= pvVar22) {
      pcVar21 = "";
    }
    pvVar23 = (void *)((long)pvVar22 + 1);
    *offset = (size_t)pvVar23;
    uVar20 = (uint)(byte)*pcVar21;
    if (cVar8 == curi_status_success) {
      if (uVar20 - 0x21 < 0x5e) goto code_r0x00101551;
      goto switchD_0010155a_caseD_22;
    }
    if (uVar20 == 0x40) {
      pcVar21 = uri + (long)pvVar16;
      sVar15 = (long)pvVar22 - (long)pvVar16;
      p_Var4 = settings->userinfo_callback;
      if (settings->url_decode == 0) {
        bVar24 = pvVar22 != pvVar16;
        pvVar16 = pvVar23;
        if (p_Var4 != (_func_int_void_ptr_char_ptr_size_t *)0x0 && bVar24) {
          iVar7 = (*p_Var4)(userData,pcVar21,sVar15);
          cVar8 = (curi_status)(iVar7 == 0);
          goto LAB_00101887;
        }
      }
      else {
        userData_00 = userData;
        cVar8 = handle_str_callback_url_decoded(p_Var4,pcVar21,sVar15,settings,userData);
        if (cVar8 != curi_status_error) {
LAB_00101887:
          if (cVar8 != curi_status_success) {
            return curi_status_canceled;
          }
          pvVar16 = (void *)*offset;
        }
      }
    }
    str = (curi_settings *)(uri + (long)pvVar16);
    pcVar10 = (curi_settings *)"";
    if (pvVar16 < len) {
      pcVar10 = str;
    }
    pcVar1 = (curi_settings *)((long)pvVar16 + 1);
    *offset = (size_t)pcVar1;
    pcVar21 = (char *)str;
    if (*(char *)&pcVar10->allocate != '[') goto LAB_001018d0;
    pcVar21 = uri + (long)pcVar1;
    if (len <= pcVar1) {
      pcVar21 = "";
    }
    pcVar10 = (curi_settings *)((long)pvVar16 + 2);
    *offset = (size_t)pcVar10;
    pcVar12 = pcVar10;
    if (*(char *)&((curi_settings *)pcVar21)->allocate == ':') {
LAB_0010167b:
      pcVar11 = uri + (long)pcVar12;
      if (len <= pcVar12) {
        pcVar11 = "";
      }
      pcVar13 = (curi_settings *)((long)&pcVar12->allocate + 1);
      *offset = (size_t)pcVar13;
      if (*pcVar11 != ':') {
LAB_00101691:
        *offset = (size_t)pcVar1;
        pcVar13 = pcVar1;
      }
      lVar19 = 6;
      pcVar12 = pcVar13;
      cVar8 = curi_status_success;
      while (cVar9 = cVar8, bVar24 = lVar19 != 0, lVar19 = lVar19 + -1, bVar24) {
        sVar15 = *offset;
        cVar8 = parse_h16_and_colon(uri,len,offset,pcVar12,userData_00);
        if (cVar8 == curi_status_error) {
          *offset = sVar15;
          cVar8 = cVar9;
        }
      }
      if (cVar9 != curi_status_error) {
        if (cVar9 == curi_status_success) {
          sVar15 = *offset;
          cVar9 = parse_h16_and_colon(uri,len,offset,pcVar12,userData_00);
          if (cVar9 == curi_status_success) {
            cVar9 = parse_h16(uri,len,offset,pcVar12,userData_00);
          }
          if (cVar9 == curi_status_error) {
            *offset = sVar15;
            cVar9 = parse_IPv4address(uri,len,offset,pcVar12,userData_00);
            if (cVar9 == curi_status_error) goto LAB_0010173b;
          }
        }
        goto LAB_001018a9;
      }
LAB_0010173b:
      *offset = (size_t)pcVar13;
      cVar9 = parse_h16(uri,len,offset,pcVar12,userData_00);
      if (cVar9 != curi_status_error) goto LAB_001018a9;
      *offset = (size_t)pcVar10;
      if (*(char *)&((curi_settings *)pcVar21)->allocate == 'v') {
        pcVar11 = uri + (long)pcVar10;
        if (len <= pcVar10) {
          pcVar11 = "";
        }
        uVar17 = (long)pvVar16 + 3;
        *offset = uVar17;
        pcVar21 = (char *)(ulong)((byte)*pcVar11 - 0x30);
        if ((0x36 < (byte)*pcVar11 - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)pcVar21 & 0x3f) & 1) == 0)) goto LAB_001018d0;
        pcVar21 = uri + uVar17;
        if (len <= uVar17) {
          pcVar21 = "";
        }
        pcVar10 = (curi_settings *)((long)pvVar16 + 4);
        *offset = (size_t)pcVar10;
        if (*(char *)&((curi_settings *)pcVar21)->allocate != '.') goto LAB_001018d0;
        cVar8 = parse_unreserved(uri,len,offset,(curi_settings *)pcVar21,userData_00);
        if (cVar8 == curi_status_error) {
          pcVar11 = uri + (long)pcVar10;
          if (len <= pcVar10) {
            pcVar11 = "";
          }
          pcVar21 = (char *)((long)pvVar16 + 5);
          *offset = (size_t)pcVar21;
          bVar2 = *pcVar11;
          if ((0x3d < (ulong)bVar2) ||
             (cVar8 = curi_status_success, (0x28001fd200000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
          {
            if (bVar2 == 0x3a) {
              pcVar10 = (curi_settings *)pcVar21;
            }
            *offset = (size_t)pcVar10;
            cVar8 = (uint)(bVar2 != 0x3a) * 2;
          }
        }
        do {
          do {
            if (cVar8 != curi_status_success) {
              if (cVar8 != curi_status_error) {
                return curi_status_canceled;
              }
              goto LAB_001018d0;
            }
            uVar17 = *offset;
            cVar8 = parse_unreserved(uri,len,offset,(curi_settings *)pcVar21,userData_00);
          } while (cVar8 != curi_status_error);
          pcVar11 = uri + uVar17;
          if (len <= uVar17) {
            pcVar11 = "";
          }
          pcVar21 = (char *)(uVar17 + 1);
          *offset = (size_t)pcVar21;
        } while (((byte)(*pcVar11 - 0x21U) < 0x1d) &&
                (cVar8 = curi_status_success,
                (0x16000fe9U >> ((byte)(*pcVar11 - 0x21U) & 0x1f) & 1) != 0));
        goto LAB_001018b9;
      }
LAB_001018d0:
      *offset = (size_t)pvVar16;
      cVar9 = parse_IPv4address(uri,len,offset,(curi_settings *)pcVar21,userData_00);
      pcVar12 = (curi_settings *)pcVar21;
      if (cVar9 == curi_status_error) {
        cVar8 = curi_status_success;
        pvVar23 = pvVar16;
LAB_001018fd:
        *offset = (size_t)pvVar23;
        do {
          if (cVar8 != curi_status_success) goto LAB_00101953;
          pvVar23 = (void *)*offset;
          pcVar21 = uri + (long)pvVar23;
          if (len <= pvVar23) {
            pcVar21 = "";
          }
          *offset = (long)pvVar23 + 1;
          cVar8 = curi_status_success;
          uVar20 = (byte)*pcVar21 - 0x21;
          if (0x5d < uVar20) goto switchD_0010192d_caseD_22;
          switch((uint)(byte)*pcVar21) {
          case 0x22:
          case 0x23:
          case 0x2f:
          case 0x3a:
          case 0x3c:
          case 0x3e:
          case 0x3f:
          case 0x40:
          case 0x5b:
          case 0x5c:
          case 0x5d:
          case 0x5e:
          case 0x60:
          case 0x7b:
          case 0x7c:
          case 0x7d:
            goto switchD_0010192d_caseD_22;
          case 0x25:
            cVar8 = parse_h8(uri,len,offset,
                             (curi_settings *)
                             ((long)&switchD_0010192d::switchdataD_00103070 +
                             (long)(int)(&switchD_0010192d::switchdataD_00103070)[uVar20]),
                             userData_00);
            if (cVar8 == curi_status_error) goto switchD_0010192d_caseD_22;
          }
        } while( true );
      }
LAB_0010194e:
      if (cVar9 == curi_status_success) goto LAB_00101953;
LAB_001019af:
      if (cVar9 == curi_status_success) {
        userData_00 = (void *)*offset;
        goto LAB_00101abb;
      }
LAB_001019bd:
      if (cVar9 == curi_status_error) goto LAB_001019c3;
    }
    else {
      lVar19 = 6;
      *offset = (size_t)pcVar1;
      cVar8 = parse_h16_and_colon(uri,len,offset,pcVar10,userData_00);
      while (cVar9 = cVar8, bVar24 = lVar19 != 0, lVar19 = lVar19 + -1, bVar24) {
        sVar15 = *offset;
        cVar8 = parse_h16_and_colon(uri,len,offset,pcVar12,userData_00);
        if (cVar8 == curi_status_error) {
          *offset = sVar15;
          cVar8 = cVar9;
        }
      }
      if (cVar9 == curi_status_error) goto LAB_00101691;
      if (cVar9 == curi_status_success) {
        pcVar12 = (curi_settings *)*offset;
        goto LAB_0010167b;
      }
LAB_001018a9:
      if (cVar9 != curi_status_success) goto LAB_0010194e;
      uVar17 = *offset;
      pcVar21 = (char *)(uVar17 + 1);
LAB_001018b9:
      pcVar11 = uri + uVar17;
      if (len <= uVar17) {
        pcVar11 = "";
      }
      *offset = (size_t)pcVar21;
      if (*pcVar11 != ']') goto LAB_001018d0;
LAB_00101953:
      userData_00 = (void *)*offset;
      sVar15 = (long)userData_00 - (long)pvVar16;
      p_Var4 = settings->host_callback;
      if (settings->url_decode != 0) {
        pcVar12 = settings;
        userData_00 = userData;
        cVar9 = handle_str_callback_url_decoded(p_Var4,(char *)str,sVar15,settings,userData);
        goto LAB_001019af;
      }
      if (p_Var4 != (_func_int_void_ptr_char_ptr_size_t *)0x0 && userData_00 != pvVar16) {
        pcVar12 = settings;
        iVar7 = (*p_Var4)(userData,(char *)str,sVar15);
        cVar9 = (curi_status)(iVar7 == 0);
        goto LAB_001019af;
      }
LAB_00101abb:
      pcVar21 = uri + (long)userData_00;
      if (len <= userData_00) {
        pcVar21 = "";
      }
      sVar15 = (long)userData_00 + 1;
      *offset = sVar15;
      if (*pcVar21 == ':') {
        pcVar21 = uri + sVar15;
        sVar18 = 0;
        while( true ) {
          pcVar11 = pcVar21 + sVar18;
          if (len <= sVar15 + sVar18) {
            pcVar11 = "";
          }
          if (9 < (byte)(*pcVar11 - 0x30U)) break;
          *offset = (long)userData_00 + sVar18 + 2;
          sVar18 = sVar18 + 1;
        }
        bVar24 = false;
        if (settings->portStr_callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && sVar18 != 0)
        {
          iVar7 = (*settings->portStr_callback)(userData,pcVar21,sVar18);
          bVar24 = iVar7 == 0;
        }
        if ((sVar18 != 0) && (!bVar24)) {
          p_Var6 = settings->port_callback;
          if (p_Var6 == (_func_int_void_ptr_uint *)0x0) goto LAB_00101b70;
          uVar20 = atoi(pcVar21);
          iVar7 = (*p_Var6)(userData,uVar20);
          bVar24 = iVar7 == 0;
        }
        if (bVar24) {
          return curi_status_canceled;
        }
      }
      else {
        *offset = (size_t)userData_00;
      }
LAB_00101b70:
      sVar15 = *offset;
      pcVar12 = settings;
      userData_00 = userData;
      cVar9 = parse_segments(uri,len,offset,settings,userData);
      if (cVar9 == curi_status_success) {
        pcVar12 = (curi_settings *)userData;
        cVar9 = handle_path(uri + sVar15,*offset - sVar15,settings,userData);
        goto LAB_001019bd;
      }
    }
  }
  else {
LAB_001019c3:
    *offset = uVar3;
    pcVar12 = settings;
    userData_00 = userData;
    cVar9 = parse_path(uri,len,offset,settings,userData);
  }
  if (cVar9 == curi_status_success) {
    sVar15 = *offset;
    pcVar12 = settings;
    userData_00 = userData;
    cVar9 = parse_query(uri,len,offset,settings,userData,1);
    if (cVar9 == curi_status_error) goto LAB_00101a14;
  }
  if (cVar9 != curi_status_success) {
    return cVar9;
  }
  sVar15 = *offset;
LAB_00101a14:
  pcVar21 = "";
  if (sVar15 < len) {
    pcVar21 = uri + sVar15;
  }
  sVar18 = sVar15 + 1;
  *offset = sVar18;
  if (*pcVar21 == '#') {
    do {
      sVar5 = *offset;
      cVar8 = parse_query_fragment_char(uri,len,offset,pcVar12,userData_00);
    } while (cVar8 == curi_status_success);
    *offset = sVar5;
    p_Var4 = settings->fragment_callback;
    if (settings->url_decode == 0) {
      if (p_Var4 != (_func_int_void_ptr_char_ptr_size_t *)0x0 && sVar5 != sVar18) {
        iVar7 = (*p_Var4)(userData,uri + sVar18,sVar5 - sVar18);
        return (uint)(iVar7 == 0);
      }
      return curi_status_success;
    }
    cVar8 = handle_str_callback_url_decoded(p_Var4,uri + sVar18,sVar5 - sVar18,settings,userData);
    if (cVar8 != curi_status_error) {
      return cVar8;
    }
  }
  *offset = sVar15;
  return curi_status_success;
code_r0x00101478:
  userData_00 = (void *)((long)&switchD_00101482::switchdataD_00103360 +
                        (long)(int)(&switchD_00101482::switchdataD_00103360)[uVar20]);
  bVar24 = true;
  uVar17 = sVar15 + 1;
  switch((uint)(byte)*pcVar21) {
  case 0x2c:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
switchD_00101482_caseD_2c:
    *offset = sVar15;
    bVar24 = false;
    uVar17 = sVar15;
  }
  goto switchD_00101482_caseD_2b;
code_r0x00101551:
  cVar8 = curi_status_success;
  switch(uVar20) {
  case 0x25:
    cVar8 = parse_h8(uri,len,offset,
                     (curi_settings *)
                     ((long)&switchD_0010155a::switchdataD_001031e8 +
                     (long)(int)(&switchD_0010155a::switchdataD_001031e8)[uVar20 - 0x21]),
                     userData_00);
    if (cVar8 != curi_status_error) {
      pvVar23 = (void *)*offset;
      break;
    }
  case 0x22:
  case 0x23:
  case 0x2f:
  case 0x3c:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x60:
  case 0x7b:
  case 0x7c:
  case 0x7d:
switchD_0010155a_caseD_22:
    *offset = (size_t)pvVar22;
    cVar8 = curi_status_error;
    pvVar23 = pvVar22;
  }
  goto switchD_0010155a_caseD_21;
switchD_0010192d_caseD_22:
  cVar8 = curi_status_error;
  goto LAB_001018fd;
}

Assistant:

static curi_status parse_full_uri(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // URI = scheme ":" hier-part [ query ] [ fragment ]
    curi_status status = curi_status_success;

    if (status == curi_status_success)
        status = parse_scheme(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char(':', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_hier_part(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        TRY(status, offset, parse_query(uri, len, offset, settings, userData, 1));

    if (status == curi_status_success)
        TRY(status, offset, parse_fragment(uri, len, offset, settings, userData));

    return status;
}